

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListViewPrivate::scrollElasticBandBy(QListViewPrivate *this,int dx,int dy)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined8 in_stack_ffffffffffffffc8;
  int pos;
  QRect *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  int pos_00;
  QRect *in_stack_ffffffffffffffe0;
  
  pos_00 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  pos = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (in_ESI < 1) {
    if (in_ESI < 0) {
      pos_00 = (int)((ulong)(in_RDI + 0x5a4) >> 0x20);
      QRect::left((QRect *)0x8865cd);
      QRect::moveLeft(in_stack_ffffffffffffffd0,pos);
    }
  }
  else {
    in_stack_ffffffffffffffe0 = (QRect *)(in_RDI + 0x5a4);
    QRect::right((QRect *)0x886595);
    QRect::moveRight(in_stack_ffffffffffffffe0,pos_00);
  }
  if (in_EDX < 1) {
    if (in_EDX < 0) {
      QRect::top((QRect *)0x88663c);
      QRect::moveTop(in_stack_ffffffffffffffe0,pos_00);
    }
  }
  else {
    QRect::bottom((QRect *)0x886605);
    QRect::moveBottom(in_stack_ffffffffffffffe0,pos_00);
  }
  return;
}

Assistant:

void QListViewPrivate::scrollElasticBandBy(int dx, int dy)
{
    if (dx > 0) // right
        elasticBand.moveRight(elasticBand.right() + dx);
    else if (dx < 0) // left
        elasticBand.moveLeft(elasticBand.left() - dx);
    if (dy > 0) // down
        elasticBand.moveBottom(elasticBand.bottom() + dy);
    else if (dy < 0) // up
        elasticBand.moveTop(elasticBand.top() - dy);
}